

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::initializeYesterday(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  tm *__tp;
  time_t tVar4;
  tm *t;
  time_t now;
  int following;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string token;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  token.field_2._8_8_ = Pig::cursor(pig);
  std::__cxx11::string::string((string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"yesterday",&local_69);
  bVar1 = Pig::skipPartial(pig,&local_68,(string *)local_48,false);
  bVar2 = false;
  if (bVar1) {
    uVar3 = std::__cxx11::string::length();
    bVar2 = (ulong)(long)minimumMatchLength <= uVar3;
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar2) {
    now._0_4_ = Pig::peek(pig);
    bVar2 = unicodeLatinAlpha((uint)now);
    if ((!bVar2) && (bVar2 = unicodeLatinDigit((uint)now), !bVar2)) {
      t = (tm *)time((time_t *)0x0);
      __tp = localtime((time_t *)&t);
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_isdst = -1;
      __tp->tm_mday = __tp->tm_mday + -1;
      tVar4 = mktime(__tp);
      this->_date = tVar4;
      this_local._7_1_ = true;
      goto LAB_00111ee7;
    }
  }
  Pig::restoreTo(pig,token.field_2._8_8_);
  this_local._7_1_ = false;
LAB_00111ee7:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Datetime::initializeYesterday (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if (pig.skipPartial ("yesterday", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_isdst = -1;
      t->tm_mday -= 1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}